

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O0

PUThreadKey * p_uthread_local_new(PDestroyFunc free_func)

{
  PUThreadKey *ret;
  PDestroyFunc free_func_local;
  
  free_func_local = (PDestroyFunc)p_malloc0(0x10);
  if (free_func_local == (PDestroyFunc)0x0) {
    printf("** Error: %s **\n","PUThread::p_uthread_local_new: failed to allocate memory");
    free_func_local = (PDestroyFunc)0x0;
  }
  else {
    *(PDestroyFunc *)(free_func_local + 8) = free_func;
  }
  return (PUThreadKey *)free_func_local;
}

Assistant:

P_LIB_API PUThreadKey *
p_uthread_local_new (PDestroyFunc free_func)
{
	PUThreadKey *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PUThreadKey))) == NULL)) {
		P_ERROR ("PUThread::p_uthread_local_new: failed to allocate memory");
		return NULL;
	}

	ret->free_func = free_func;

	return ret;
}